

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr * __thiscall c4::yml::Tree::val_ref(Tree *this,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  csubstr *pcVar4;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar4 = (csubstr *)(*pcVar2)();
        return pcVar4;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((this->m_buf[node].m_type.type & VALREF) != NOTYPE) {
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          pcVar4 = (csubstr *)(*pcVar2)();
          return pcVar4;
        }
      }
      (*(code *)PTR_error_impl_00243548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    NVar1 = this->m_buf[node].m_type.type;
    if ((NVar1 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar1 >> 9 & 1) == 0) goto LAB_001eee31;
  }
  if ((s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      pcVar4 = (csubstr *)(*pcVar2)();
      return pcVar4;
    }
  }
  (*(code *)PTR_error_impl_00243548)
            ("check failed: is_val_ref(node) && ! has_val_anchor(node)",0x38,
             (anonymous_namespace)::s_default_callbacks);
LAB_001eee31:
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar4 = (csubstr *)(*pcVar2)();
        return pcVar4;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return &this->m_buf[node].m_val.anchor;
}

Assistant:

csubstr    const& val_ref   (size_t node) const { RYML_ASSERT(is_val_ref(node) && ! has_val_anchor(node)); return _p(node)->m_val.anchor; }